

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O2

char * deqp::gls::RandomArrayGenerator::generateArray
                 (int seed,GLValue min,GLValue max,int count,int componentCount,int stride,
                 InputType type)

{
  GLValue max_00;
  char *pcVar1;
  undefined8 uVar2;
  int componentNdx;
  int iVar3;
  int iVar4;
  GLValue min_00;
  deRandom rnd;
  undefined4 uStack_4c;
  deRandom local_40;
  
  uVar2 = max._0_8_;
  deRandom_init(&local_40,seed);
  if (stride == 0) {
    stride = Array::inputTypeSize::size[(int)type] * componentCount;
  }
  pcVar1 = (char *)operator_new__((long)(stride * count));
  iVar4 = 0;
  if (componentCount < 1) {
    componentCount = 0;
  }
  if (count < 1) {
    count = iVar4;
  }
  for (; iVar4 != count; iVar4 = iVar4 + 1) {
    for (iVar3 = 0; componentCount != iVar3; iVar3 = iVar3 + 1) {
      max_00._4_4_ = uStack_4c;
      max_00.type = max.type;
      max_00.field_1 = max.field_1;
      min_00.field_1 = min.field_1;
      min_00._0_8_ = uVar2;
      setData(pcVar1 + (Array::inputTypeSize::size[(int)type] * iVar3 + iVar4 * stride),type,
              &local_40,min_00,max_00);
    }
  }
  return pcVar1;
}

Assistant:

char* RandomArrayGenerator::generateArray (int seed, GLValue min, GLValue max, int count, int componentCount, int stride, Array::InputType type)
{
	char* data = NULL;

	deRandom rnd;
	deRandom_init(&rnd, seed);

	if (stride == 0)
		stride = componentCount * Array::inputTypeSize(type);

	data = new char[stride * count];

	for (int vertexNdx = 0; vertexNdx < count; vertexNdx++)
	{
		for (int componentNdx = 0; componentNdx < componentCount; componentNdx++)
		{
			setData(&(data[vertexNdx * stride + Array::inputTypeSize(type) * componentNdx]), type, rnd, min, max);
		}
	}

	return data;
}